

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O1

void dradb4(int ido,int l1,float *cc,float *ch,float *wa1,float *wa2,float *wa3)

{
  ulong uVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  float *pfVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  uVar5 = l1 * ido;
  iVar2 = ido * 4;
  iVar9 = ido * 2;
  if (0 < l1) {
    lVar14 = (long)(int)uVar5;
    lVar12 = (long)iVar9;
    pfVar4 = ch;
    pfVar13 = cc;
    iVar10 = l1;
    do {
      fVar15 = pfVar13[lVar12 + -1] + pfVar13[lVar12 + -1];
      fVar16 = pfVar13[lVar12] + pfVar13[lVar12];
      fVar18 = *pfVar13 - pfVar13[lVar12 * 2 + -1];
      fVar17 = *pfVar13 + pfVar13[lVar12 * 2 + -1];
      *pfVar4 = fVar15 + fVar17;
      pfVar4[lVar14] = fVar18 - fVar16;
      pfVar4[lVar14 * 2] = fVar17 - fVar15;
      pfVar4[lVar14 * 3] = fVar18 + fVar16;
      pfVar13 = pfVar13 + iVar2;
      pfVar4 = pfVar4 + ido;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  if (1 < ido) {
    if (ido == 2) {
      if (l1 < 1) {
        return;
      }
    }
    else {
      if (0 < l1) {
        uVar1 = (ulong)(uint)ido;
        uVar7 = (ulong)uVar5;
        pfVar4 = ch + uVar7;
        pfVar13 = ch + uVar7 * 3;
        pfVar6 = ch + uVar7 * 2;
        iVar11 = 0;
        iVar8 = 0;
        pfVar3 = ch;
        iVar10 = iVar2;
        do {
          uVar7 = 2;
          lVar12 = -2;
          do {
            fVar15 = cc[(long)iVar11 + uVar7] + cc[iVar10 + lVar12];
            fVar17 = cc[(long)iVar11 + uVar7] - cc[iVar10 + lVar12];
            fVar22 = cc[(long)iVar9 + uVar7] - cc[iVar9 + lVar12];
            fVar21 = cc[(long)iVar9 + uVar7] + cc[iVar9 + lVar12];
            fVar18 = cc[(long)iVar11 + (uVar7 - 1)] - cc[(long)iVar10 + lVar12 + -1];
            fVar16 = cc[(long)iVar11 + (uVar7 - 1)] + cc[(long)iVar10 + lVar12 + -1];
            fVar19 = cc[(long)iVar9 + (uVar7 - 1)] - cc[(long)iVar9 + lVar12 + -1];
            fVar20 = cc[(long)iVar9 + (uVar7 - 1)] + cc[(long)iVar9 + lVar12 + -1];
            pfVar3[uVar7 - 1] = fVar16 + fVar20;
            fVar16 = fVar16 - fVar20;
            pfVar3[uVar7] = fVar17 + fVar22;
            fVar17 = fVar17 - fVar22;
            fVar20 = fVar18 - fVar21;
            fVar18 = fVar18 + fVar21;
            fVar21 = fVar15 + fVar19;
            fVar15 = fVar15 - fVar19;
            pfVar4[uVar7 - 1] = wa1[uVar7 - 2] * fVar20 - wa1[uVar7 - 1] * fVar21;
            pfVar4[uVar7] = fVar21 * wa1[uVar7 - 2] + fVar20 * wa1[uVar7 - 1];
            pfVar6[uVar7 - 1] = wa2[uVar7 - 2] * fVar16 - wa2[uVar7 - 1] * fVar17;
            pfVar6[uVar7] = fVar17 * wa2[uVar7 - 2] + fVar16 * wa2[uVar7 - 1];
            pfVar13[uVar7 - 1] = wa3[uVar7 - 2] * fVar18 - wa3[uVar7 - 1] * fVar15;
            pfVar13[uVar7] = fVar15 * wa3[uVar7 - 2] + fVar18 * wa3[uVar7 - 1];
            uVar7 = uVar7 + 2;
            lVar12 = lVar12 + -2;
          } while (uVar7 < uVar1);
          iVar8 = iVar8 + 1;
          iVar11 = iVar11 + iVar2;
          iVar9 = iVar9 + iVar2;
          iVar10 = iVar10 + iVar2;
          pfVar3 = pfVar3 + uVar1;
          pfVar4 = pfVar4 + uVar1;
          pfVar13 = pfVar13 + uVar1;
          pfVar6 = pfVar6 + uVar1;
        } while (iVar8 != l1);
      }
      if ((ido & 1U) != 0 || l1 < 1) {
        return;
      }
    }
    uVar1 = (ulong)(uint)ido;
    uVar7 = (ulong)uVar5;
    lVar12 = (long)(ido + -1) << 2;
    do {
      fVar18 = cc[uVar1] + cc[ido * 3];
      fVar17 = cc[ido * 3] - cc[uVar1];
      fVar16 = cc[uVar1 - 1] - cc[(long)(ido * 3) + -1];
      fVar15 = cc[uVar1 - 1] + cc[(long)(ido * 3) + -1];
      *(float *)((long)ch + lVar12) = fVar15 + fVar15;
      *(float *)((long)ch + lVar12 + uVar7 * 4) = (fVar16 - fVar18) * 1.4142135;
      *(float *)((long)ch + lVar12 + uVar7 * 8) = fVar17 + fVar17;
      *(float *)((long)ch + lVar12 + uVar7 * 0xc) = (fVar16 + fVar18) * -1.4142135;
      cc = cc + iVar2;
      lVar12 = lVar12 + uVar1 * 4;
      l1 = l1 + -1;
    } while (l1 != 0);
  }
  return;
}

Assistant:

static void dradb4(int ido,int l1,float *cc,float *ch,float *wa1,
                          float *wa2,float *wa3){
  static float sqrt2=1.414213562373095f;
  int i,k,t0,t1,t2,t3,t4,t5,t6,t7,t8;
  float ci2,ci3,ci4,cr2,cr3,cr4,ti1,ti2,ti3,ti4,tr1,tr2,tr3,tr4;
  t0=l1*ido;

  t1=0;
  t2=ido<<2;
  t3=0;
  t6=ido<<1;
  for(k=0;k<l1;k++){
    t4=t3+t6;
    t5=t1;
    tr3=cc[t4-1]+cc[t4-1];
    tr4=cc[t4]+cc[t4];
    tr1=cc[t3]-cc[(t4+=t6)-1];
    tr2=cc[t3]+cc[t4-1];
    ch[t5]=tr2+tr3;
    ch[t5+=t0]=tr1-tr4;
    ch[t5+=t0]=tr2-tr3;
    ch[t5+=t0]=tr1+tr4;
    t1+=ido;
    t3+=t2;
  }

  if(ido<2)return;
  if(ido==2)goto L105;

  t1=0;
  for(k=0;k<l1;k++){
    t5=(t4=(t3=(t2=t1<<2)+t6))+t6;
    t7=t1;
    for(i=2;i<ido;i+=2){
      t2+=2;
      t3+=2;
      t4-=2;
      t5-=2;
      t7+=2;
      ti1=cc[t2]+cc[t5];
      ti2=cc[t2]-cc[t5];
      ti3=cc[t3]-cc[t4];
      tr4=cc[t3]+cc[t4];
      tr1=cc[t2-1]-cc[t5-1];
      tr2=cc[t2-1]+cc[t5-1];
      ti4=cc[t3-1]-cc[t4-1];
      tr3=cc[t3-1]+cc[t4-1];
      ch[t7-1]=tr2+tr3;
      cr3=tr2-tr3;
      ch[t7]=ti2+ti3;
      ci3=ti2-ti3;
      cr2=tr1-tr4;
      cr4=tr1+tr4;
      ci2=ti1+ti4;
      ci4=ti1-ti4;

      ch[(t8=t7+t0)-1]=wa1[i-2]*cr2-wa1[i-1]*ci2;
      ch[t8]=wa1[i-2]*ci2+wa1[i-1]*cr2;
      ch[(t8+=t0)-1]=wa2[i-2]*cr3-wa2[i-1]*ci3;
      ch[t8]=wa2[i-2]*ci3+wa2[i-1]*cr3;
      ch[(t8+=t0)-1]=wa3[i-2]*cr4-wa3[i-1]*ci4;
      ch[t8]=wa3[i-2]*ci4+wa3[i-1]*cr4;
    }
    t1+=ido;
  }

  if(ido%2 == 1)return;

 L105:

  t1=ido;
  t2=ido<<2;
  t3=ido-1;
  t4=ido+(ido<<1);
  for(k=0;k<l1;k++){
    t5=t3;
    ti1=cc[t1]+cc[t4];
    ti2=cc[t4]-cc[t1];
    tr1=cc[t1-1]-cc[t4-1];
    tr2=cc[t1-1]+cc[t4-1];
    ch[t5]=tr2+tr2;
    ch[t5+=t0]=sqrt2*(tr1-ti1);
    ch[t5+=t0]=ti2+ti2;
    ch[t5+=t0]=-sqrt2*(tr1+ti1);

    t3+=ido;
    t1+=t2;
    t4+=t2;
  }
}